

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArguments.cxx
# Opt level: O1

void __thiscall cmsys::CommandLineArguments::GenerateHelp(CommandLineArguments *this)

{
  char *pcVar1;
  undefined1 *puVar2;
  iterator iVar3;
  _Rb_tree<cmsys::String,cmsys::String,std::_Identity<cmsys::String>,std::less<cmsys::String>,std::allocator<cmsys::String>>
  *p_Var4;
  _Base_ptr p_Var5;
  Internal *pIVar6;
  iterator __position;
  _Rb_tree_node_base *p_Var7;
  mapped_type *pmVar8;
  _Rb_tree_node_base *p_Var9;
  size_t sVar10;
  long lVar11;
  ulong uVar12;
  _Base_ptr p_Var13;
  _Self __tmp_1;
  char *__s;
  _Self __tmp;
  ulong uVar14;
  ulong uVar15;
  int iVar16;
  _Self __tmp_4;
  char argument [100];
  MapArgs mp;
  char format [80];
  ostringstream str;
  char buffer [80];
  undefined1 local_2f8 [16];
  long local_2e8 [11];
  _Rb_tree<cmsys::String,_std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings>,_std::_Select1st<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings>_>,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings>_>_>
  local_290;
  long local_260;
  allocator local_258 [88];
  long local_200 [14];
  ios_base local_190 [264];
  char local_88 [88];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_200);
  local_290._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_290._M_impl.super__Rb_tree_header._M_header;
  local_290._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_290._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_290._M_impl.super__Rb_tree_header._M_node_count = 0;
  pIVar6 = this->Internals;
  p_Var5 = *(_Base_ptr *)
            ((long)&(pIVar6->Callbacks).
                    super_map<cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure>_>_>
                    ._M_t._M_impl.super__Rb_tree_header._M_header + 0x10);
  local_290._M_impl.super__Rb_tree_header._M_header._M_right =
       local_290._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((_Rb_tree_header *)p_Var5 !=
      &(pIVar6->Callbacks).
       super_map<cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure>_>_>
       ._M_t._M_impl.super__Rb_tree_header) {
    do {
      std::__cxx11::string::string((string *)local_2f8,(char *)p_Var5[3]._M_left,local_258);
      iVar3 = std::
              _Rb_tree<cmsys::String,_std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings>,_std::_Select1st<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings>_>,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings>_>_>
              ::find(&local_290,(key_type *)local_2f8);
      if ((long *)local_2f8._0_8_ != local_2e8) {
        operator_delete((void *)local_2f8._0_8_,local_2e8[0] + 1);
      }
      p_Var7 = p_Var5 + 1;
      if ((_Rb_tree_header *)iVar3._M_node != &local_290._M_impl.super__Rb_tree_header) {
        std::
        _Rb_tree<cmsys::String,cmsys::String,std::_Identity<cmsys::String>,std::less<cmsys::String>,std::allocator<cmsys::String>>
        ::_M_insert_unique<cmsys::String_const&>
                  ((_Rb_tree<cmsys::String,cmsys::String,std::_Identity<cmsys::String>,std::less<cmsys::String>,std::allocator<cmsys::String>>
                    *)(iVar3._M_node + 2),(String *)p_Var7);
      }
      p_Var4 = (_Rb_tree<cmsys::String,cmsys::String,std::_Identity<cmsys::String>,std::less<cmsys::String>,std::allocator<cmsys::String>>
                *)std::
                  map<cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings>_>_>
                  ::operator[]((map<cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings>_>_>
                                *)&local_290,(key_type *)p_Var7);
      std::
      _Rb_tree<cmsys::String,cmsys::String,std::_Identity<cmsys::String>,std::less<cmsys::String>,std::allocator<cmsys::String>>
      ::_M_insert_unique<cmsys::String_const&>(p_Var4,(String *)p_Var7);
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
      pIVar6 = this->Internals;
    } while ((_Rb_tree_header *)p_Var5 !=
             &(pIVar6->Callbacks).
              super_map<cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure>_>_>
              ._M_t._M_impl.super__Rb_tree_header);
  }
  p_Var5 = *(_Base_ptr *)
            ((long)&(pIVar6->Callbacks).
                    super_map<cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure>_>_>
                    ._M_t._M_impl.super__Rb_tree_header._M_header + 0x10);
  if ((_Rb_tree_header *)p_Var5 !=
      &(this->Internals->Callbacks).
       super_map<cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure>_>_>
       ._M_t._M_impl.super__Rb_tree_header) {
    do {
      std::__cxx11::string::string((string *)local_2f8,(char *)p_Var5[3]._M_left,local_258);
      iVar3 = std::
              _Rb_tree<cmsys::String,_std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings>,_std::_Select1st<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings>_>,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings>_>_>
              ::find(&local_290,(key_type *)local_2f8);
      if ((long *)local_2f8._0_8_ != local_2e8) {
        operator_delete((void *)local_2f8._0_8_,local_2e8[0] + 1);
      }
      p_Var7 = p_Var5 + 1;
      if ((_Rb_tree_header *)iVar3._M_node == &local_290._M_impl.super__Rb_tree_header) {
        p_Var4 = (_Rb_tree<cmsys::String,cmsys::String,std::_Identity<cmsys::String>,std::less<cmsys::String>,std::allocator<cmsys::String>>
                  *)std::
                    map<cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings>_>_>
                    ::operator[]((map<cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings>_>_>
                                  *)&local_290,(key_type *)p_Var7);
        std::
        _Rb_tree<cmsys::String,cmsys::String,std::_Identity<cmsys::String>,std::less<cmsys::String>,std::allocator<cmsys::String>>
        ::_M_insert_unique<cmsys::String_const&>(p_Var4,(String *)p_Var7);
      }
      else {
        std::
        _Rb_tree<cmsys::String,cmsys::String,std::_Identity<cmsys::String>,std::less<cmsys::String>,std::allocator<cmsys::String>>
        ::_M_insert_unique<cmsys::String_const&>
                  ((_Rb_tree<cmsys::String,cmsys::String,std::_Identity<cmsys::String>,std::less<cmsys::String>,std::allocator<cmsys::String>>
                    *)(iVar3._M_node + 2),(String *)p_Var7);
        __position = std::
                     _Rb_tree<cmsys::String,_std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings>,_std::_Select1st<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings>_>,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings>_>_>
                     ::find(&local_290,(key_type *)p_Var7);
        for (p_Var7 = __position._M_node[2]._M_right;
            p_Var7 != (_Rb_tree_node_base *)&__position._M_node[2]._M_parent;
            p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7)) {
          std::
          _Rb_tree<cmsys::String,cmsys::String,std::_Identity<cmsys::String>,std::less<cmsys::String>,std::allocator<cmsys::String>>
          ::_M_insert_unique<cmsys::String_const&>
                    ((_Rb_tree<cmsys::String,cmsys::String,std::_Identity<cmsys::String>,std::less<cmsys::String>,std::allocator<cmsys::String>>
                      *)(iVar3._M_node + 2),(String *)(p_Var7 + 1));
        }
        std::
        _Rb_tree<cmsys::String,_std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings>,_std::_Select1st<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings>_>,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings>_>_>
        ::_M_erase_aux(&local_290,(const_iterator)__position._M_node);
      }
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
    } while ((_Rb_tree_header *)p_Var5 !=
             &(this->Internals->Callbacks).
              super_map<cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure>_>_>
              ._M_t._M_impl.super__Rb_tree_header);
  }
  p_Var5 = (_Base_ptr)0x0;
  p_Var7 = local_290._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((_Rb_tree_header *)local_290._M_impl.super__Rb_tree_header._M_header._M_left !=
      &local_290._M_impl.super__Rb_tree_header) {
    do {
      for (p_Var9 = p_Var7[2]._M_right; p_Var9 != (_Rb_tree_node_base *)&p_Var7[2]._M_parent;
          p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9)) {
        p_Var13 = p_Var9[1]._M_parent;
        pmVar8 = std::
                 map<cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure>_>_>
                 ::operator[](&(this->Internals->Callbacks).
                               super_map<cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure>_>_>
                              ,(key_type *)(p_Var9 + 1));
        iVar16 = pmVar8->ArgumentType;
        if (iVar16 == 1) {
          p_Var13 = (_Base_ptr)((long)&p_Var13->_M_color + 3);
        }
        else if ((iVar16 == 2) || (iVar16 == 3)) {
          p_Var13 = (_Base_ptr)&p_Var13->field_0x4;
        }
        if (p_Var5 < p_Var13) {
          p_Var5 = p_Var13;
        }
      }
      p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7);
    } while ((_Rb_tree_header *)p_Var7 != &local_290._M_impl.super__Rb_tree_header);
  }
  sprintf((char *)local_258,"  %%-%us  ",(ulong)p_Var5 & 0xffffffff);
  if ((_Rb_tree_header *)local_290._M_impl.super__Rb_tree_header._M_header._M_left !=
      &local_290._M_impl.super__Rb_tree_header) {
    local_260 = -5 - (long)p_Var5;
    p_Var13 = local_290._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      for (p_Var7 = p_Var13[2]._M_right; p_Var7 != (_Rb_tree_node_base *)&p_Var13[2]._M_parent;
          p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7)) {
        std::ios::widen((char)*(undefined8 *)(local_200[0] + -0x18));
        std::ostream::put('\0');
        std::ostream::flush();
        strcpy(local_2f8,*(char **)(p_Var7 + 1));
        pmVar8 = std::
                 map<cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure>_>_>
                 ::operator[](&(this->Internals->Callbacks).
                               super_map<cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure>_>_>
                              ,(key_type *)(p_Var7 + 1));
        switch(pmVar8->ArgumentType) {
        case 1:
          sVar10 = strlen(local_2f8);
          *(undefined4 *)(local_2f8 + sVar10) = 0x74706f;
          break;
        case 2:
          sVar10 = strlen(local_2f8);
          *(undefined4 *)(local_2f8 + sVar10) = 0x74706f20;
          goto LAB_0012cc39;
        case 3:
          sVar10 = strlen(local_2f8);
          *(undefined4 *)(local_2f8 + sVar10) = 0x74706f3d;
LAB_0012cc39:
          local_2f8[sVar10 + 4] = 0;
          break;
        case 4:
          sVar10 = strlen(local_2f8);
          *(undefined8 *)(local_2f8 + sVar10) = 0x74706f2074706f20;
          *(undefined8 *)(local_2f8 + sVar10 + 5) = 0x2e2e2e2074706f;
        }
        sprintf(local_88,(char *)local_258,local_2f8);
        sVar10 = strlen(local_88);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_200,local_88,sVar10);
      }
      pmVar8 = std::
               map<cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure>_>_>
               ::operator[](&(this->Internals->Callbacks).
                             super_map<cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure>_>_>
                            ,(key_type *)(p_Var13 + 1));
      __s = pmVar8->Help;
      sVar10 = strlen(__s);
      if (sVar10 != 0) {
        iVar16 = 0;
        do {
          if (*__s != '\0') {
            lVar11 = 1;
            do {
              if ((*__s == ' ') || (*__s == '\t')) {
                __s = __s + 1;
                sVar10 = sVar10 - 1;
              }
              pcVar1 = __s + lVar11;
              lVar11 = lVar11 + 1;
            } while (*pcVar1 != '\0');
          }
          puVar2 = &p_Var5->field_0x4;
          if (iVar16 != 0) {
            for (; puVar2 != (undefined1 *)0x0; puVar2 = puVar2 + -1) {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_200," ",1);
            }
          }
          uVar12 = (ulong)this->LineLength - (long)&p_Var5->field_0x4;
          uVar15 = sVar10;
          if (uVar12 < sVar10) {
            uVar14 = (ulong)this->LineLength + local_260;
            do {
              uVar15 = uVar12;
              if ((uVar14 == 0) || (pcVar1 = __s + uVar14, uVar15 = uVar14, *pcVar1 == ' ')) break;
              uVar14 = uVar14 - 1;
            } while (*pcVar1 != '\t');
          }
          std::ostream::write((char *)local_200,(long)__s);
          std::ios::widen((char)*(undefined8 *)(local_200[0] + -0x18));
          std::ostream::put('\0');
          std::ostream::flush();
          __s = __s + uVar15;
          iVar16 = iVar16 + 1;
          sVar10 = sVar10 - uVar15;
        } while (sVar10 != 0);
      }
      p_Var13 = (_Base_ptr)std::_Rb_tree_increment(p_Var13);
    } while ((_Rb_tree_header *)p_Var13 != &local_290._M_impl.super__Rb_tree_header);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&this->Help,(string *)local_2f8);
  if ((long *)local_2f8._0_8_ != local_2e8) {
    operator_delete((void *)local_2f8._0_8_,local_2e8[0] + 1);
  }
  std::
  _Rb_tree<cmsys::String,_std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings>,_std::_Select1st<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings>_>,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings>_>_>
  ::~_Rb_tree(&local_290);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_200);
  std::ios_base::~ios_base(local_190);
  return;
}

Assistant:

void CommandLineArguments::GenerateHelp()
{
  std::ostringstream str;
  
  // Collapse all arguments into the map of vectors of all arguments that do
  // the same thing.
  CommandLineArguments::Internal::CallbacksMap::iterator it;
  typedef std::map<CommandLineArguments::Internal::String,
     CommandLineArguments::Internal::SetOfStrings > MapArgs;
  MapArgs mp;
  MapArgs::iterator mpit, smpit;
  for ( it = this->Internals->Callbacks.begin();
    it != this->Internals->Callbacks.end();
    it ++ )
    {
    CommandLineArgumentsCallbackStructure *cs = &(it->second);
    mpit = mp.find(cs->Help);
    if ( mpit != mp.end() )
      {
      mpit->second.insert(it->first);
      mp[it->first].insert(it->first);
      }
    else
      {
      mp[it->first].insert(it->first);
      }
    }
  for ( it = this->Internals->Callbacks.begin();
    it != this->Internals->Callbacks.end();
    it ++ )
    {
    CommandLineArgumentsCallbackStructure *cs = &(it->second);
    mpit = mp.find(cs->Help);
    if ( mpit != mp.end() )
      {
      mpit->second.insert(it->first);
      smpit = mp.find(it->first);
      CommandLineArguments::Internal::SetOfStrings::iterator sit;
      for ( sit = smpit->second.begin(); sit != smpit->second.end(); sit++ )
        {
        mpit->second.insert(*sit);
        }
      mp.erase(smpit);
      }
    else
      {
      mp[it->first].insert(it->first);
      }
    }
 
  // Find the length of the longest string
  CommandLineArguments::Internal::String::size_type maxlen = 0;
  for ( mpit = mp.begin();
    mpit != mp.end();
    mpit ++ )
    {
    CommandLineArguments::Internal::SetOfStrings::iterator sit;
    for ( sit = mpit->second.begin(); sit != mpit->second.end(); sit++ )
      {
      CommandLineArguments::Internal::String::size_type clen = sit->size();
      switch ( this->Internals->Callbacks[*sit].ArgumentType )
        {
        case CommandLineArguments::NO_ARGUMENT:     clen += 0; break;
        case CommandLineArguments::CONCAT_ARGUMENT: clen += 3; break;
        case CommandLineArguments::SPACE_ARGUMENT:  clen += 4; break;
        case CommandLineArguments::EQUAL_ARGUMENT:  clen += 4; break;
        }
      if ( clen > maxlen )
        {
        maxlen = clen;
        }
      }
    }

  // Create format for that string
  char format[80];
  sprintf(format, "  %%-%us  ", static_cast<unsigned int>(maxlen));

  maxlen += 4; // For the space before and after the option

  // Print help for each option
  for ( mpit = mp.begin();
    mpit != mp.end();
    mpit ++ )
    {
    CommandLineArguments::Internal::SetOfStrings::iterator sit;
    for ( sit = mpit->second.begin(); sit != mpit->second.end(); sit++ )
      {
      str << std::endl;
      char argument[100];
      sprintf(argument, "%s", sit->c_str());
      switch ( this->Internals->Callbacks[*sit].ArgumentType )
        {
        case CommandLineArguments::NO_ARGUMENT: break;
        case CommandLineArguments::CONCAT_ARGUMENT: strcat(argument, "opt"); break;
        case CommandLineArguments::SPACE_ARGUMENT:  strcat(argument, " opt"); break;
        case CommandLineArguments::EQUAL_ARGUMENT:  strcat(argument, "=opt"); break;
        case CommandLineArguments::MULTI_ARGUMENT:  strcat(argument, " opt opt ..."); break;
        }
      char buffer[80];
      sprintf(buffer, format, argument);
      str << buffer;
      }
    const char* ptr = this->Internals->Callbacks[mpit->first].Help;
    size_t len = strlen(ptr);
    int cnt = 0;
    while ( len > 0)
      {
      // If argument with help is longer than line length, split it on previous
      // space (or tab) and continue on the next line
      CommandLineArguments::Internal::String::size_type cc;
      for ( cc = 0; ptr[cc]; cc ++ )
        {
        if ( *ptr == ' ' || *ptr == '\t' )
          {
          ptr ++;
          len --;
          }
        }
      if ( cnt > 0 )
        {
        for ( cc = 0; cc < maxlen; cc ++ )
          {
          str << " ";
          }
        }
      CommandLineArguments::Internal::String::size_type skip = len;
      if ( skip > this->LineLength - maxlen )
        {
        skip = this->LineLength - maxlen;
        for ( cc = skip-1; cc > 0; cc -- )
          {
          if ( ptr[cc] == ' ' || ptr[cc] == '\t' )
            {
            break;
            }
          }
        if ( cc != 0 )
          {
          skip = cc;
          }
        }
      str.write(ptr, static_cast<std::streamsize>(skip));
      str << std::endl;
      ptr += skip;
      len -= skip;
      cnt ++;
      }
    }
  /*
  // This can help debugging help string
  str << endl;
  unsigned int cc;
  for ( cc = 0; cc < this->LineLength; cc ++ )
    {
    str << cc % 10;
    }
  str << endl;
  */
  this->Help = str.str();
}